

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O0

void opj_destroy_cstr_info_v2(opj_codestream_info_v2_t **cstr_info)

{
  long *in_RDI;
  
  if (in_RDI != (long *)0x0) {
    if (*(long *)(*in_RDI + 0x38) != 0) {
      free(*(void **)(*in_RDI + 0x38));
    }
    free((void *)*in_RDI);
    *in_RDI = 0;
  }
  return;
}

Assistant:

void OPJ_CALLCONV opj_destroy_cstr_info_v2(opj_codestream_info_v2_t **cstr_info) {
	if (cstr_info) {

		if ((*cstr_info)->m_default_tile_info.tccp_info){
			opj_free((*cstr_info)->m_default_tile_info.tccp_info);
		}

		if ((*cstr_info)->tile_info){
			/* FIXME not used for the moment*/
		}

		opj_free((*cstr_info));
		(*cstr_info) = NULL;
	}
}